

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

bool __thiscall llvm::FoldingSetNodeID::operator==(FoldingSetNodeID *this,FoldingSetNodeID *RHS)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (this->Bits).super_SmallVectorImpl<unsigned_int>.
          super_SmallVectorTemplateBase<unsigned_int,_true>.
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  if (uVar1 == (RHS->Bits).super_SmallVectorImpl<unsigned_int>.
               super_SmallVectorTemplateBase<unsigned_int,_true>.
               super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size) {
    iVar2 = bcmp((this->Bits).super_SmallVectorImpl<unsigned_int>.
                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                 super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,
                 (RHS->Bits).super_SmallVectorImpl<unsigned_int>.
                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                 super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,
                 (ulong)uVar1 << 2);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

size_t size() const { return Size; }